

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

float __thiscall
rlottie::internal::model::KeyFrames<float,_void>::value(KeyFrames<float,_void> *this,int frameNo)

{
  pointer pFVar1;
  pointer this_00;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)frameNo;
  this_00 = (this->frames_).
            super__Vector_base<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (fVar2 <= this_00->start_) {
    return (this_00->value_).start_;
  }
  pFVar1 = (this->frames_).
           super__Vector_base<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (fVar2 < pFVar1[-1].end_) {
    while( true ) {
      if (this_00 == pFVar1) {
        return 0.0;
      }
      if ((this_00->start_ <= fVar2) && (fVar2 < this_00->end_)) break;
      this_00 = this_00 + 1;
    }
    fVar3 = Frame::progress(this_00,frameNo);
    fVar2 = (this_00->value_).start_;
    return fVar3 * ((this_00->value_).end_ - fVar2) + fVar2;
  }
  return pFVar1[-1].value_.end_;
}

Assistant:

T value(int frameNo) const
    {
        if (frames_.front().start_ >= frameNo)
            return frames_.front().value_.start_;
        if (frames_.back().end_ <= frameNo) return frames_.back().value_.end_;

        for (const auto &keyFrame : frames_) {
            if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_)
                return keyFrame.value(frameNo);
        }
        return {};
    }